

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

void write_value(ValueArray *value_array,CrispyValue value)

{
  uint64_t uVar1;
  CrispyValue *pCVar2;
  uint64_t local_28;
  ValueArray *value_array_local;
  CrispyValue value_local;
  
  if (value_array->cap <= value_array->count) {
    if (value_array->cap < 8) {
      local_28 = 8;
    }
    else {
      local_28 = value_array->cap << 1;
    }
    value_array->cap = local_28;
    pCVar2 = (CrispyValue *)reallocate(value_array->values,value_array->cap << 4);
    value_array->values = pCVar2;
  }
  pCVar2 = value_array->values;
  uVar1 = value_array->count;
  value_array->count = uVar1 + 1;
  *(ulong *)(pCVar2 + uVar1) = CONCAT44(value_array_local._4_4_,value.type);
  pCVar2[uVar1].field_1.p_value = (uint64_t)value.field_1;
  return;
}

Assistant:

void write_value(ValueArray *value_array, CrispyValue value) {
    if (value_array->count >= value_array->cap) {
        value_array->cap = GROW_CAP(value_array->cap);
        value_array->values = GROW_ARR(value_array->values, CrispyValue, value_array->cap);
    }

    value_array->values[value_array->count++] = value;
}